

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2Bug18458852(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_298;
  undefined1 local_108 [8];
  RE2 re;
  char b [18];
  
  re.named_groups_once_._M_once = 0x41050528;
  re.group_names_once_._M_once = 0x5b242841;
  RE2::RE2((RE2 *)local_108,(char *)&re.named_groups_once_);
  bVar1 = RE2::ok((RE2 *)local_108);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x606);
    poVar2 = LogMessage::stream(&local_298);
    std::operator<<(poVar2,"Check failed: !re.ok()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_298);
  }
  RE2::~RE2((RE2 *)local_108);
  return;
}

Assistant:

TEST(RE2, Bug18458852) {
  // Bug in parser accepting invalid (too large) rune,
  // causing compiler to fail in DCHECK in UTF-8
  // character class code.
  const char b[] = {
      (char)0x28, (char)0x05, (char)0x05, (char)0x41, (char)0x41, (char)0x28,
      (char)0x24, (char)0x5b, (char)0x5e, (char)0xf5, (char)0x87, (char)0x87,
      (char)0x90, (char)0x29, (char)0x5d, (char)0x29, (char)0x29, (char)0x00,
  };
  RE2 re(b);
  CHECK(!re.ok());
}